

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SavepointMethod(sqlite3_vtab *pVtab,int iSavepoint)

{
  _func_int_sqlite3_vtab_cursor_ptr *p_Var1;
  sqlite3_module *psVar2;
  sqlite3_stmt *pStmt;
  int iVar3;
  Mem *pMem;
  i64 iVar4;
  int iVar5;
  sqlite3_stmt *psStack_30;
  
  if (*(char *)&pVtab[0x13].pModule != '\0') {
    return 0;
  }
  p_Var1 = (pVtab[1].pModule)->xClose;
  iVar3 = sqlite3Fts3PendingTermsFlush((Fts3Table *)pVtab);
  if (iVar3 == 0) {
    iVar3 = 0;
    if (((4 < *(uint *)((long)&pVtab[4].pModule + 4)) && (*(int *)&pVtab[4].pModule != 0)) &&
       (iVar3 = 0, *(int *)&pVtab[4].pModule != 0xff)) {
      psStack_30 = (sqlite3_stmt *)0x0;
      iVar5 = 0;
      iVar3 = fts3SqlStmt((Fts3Table *)pVtab,0x24,&psStack_30,(sqlite3_value **)0x0);
      pStmt = psStack_30;
      if (iVar3 == 0) {
        iVar3 = sqlite3_step(psStack_30);
        iVar5 = 0;
        if (iVar3 == 100) {
          pMem = columnMem(pStmt,0);
          iVar4 = sqlite3VdbeIntValue(pMem);
          iVar5 = (int)iVar4;
          columnMallocFailure(pStmt);
        }
        iVar3 = sqlite3_reset(pStmt);
      }
      iVar5 = iVar5 * *(int *)((long)&pVtab[4].pModule + 4);
      iVar5 = iVar5 / 2 + iVar5;
      if (0x40 < iVar5) {
        iVar3 = sqlite3Fts3Incrmerge((Fts3Table *)pVtab,iVar5,*(int *)&pVtab[4].pModule);
      }
    }
  }
  sqlite3_blob_close((sqlite3_blob *)pVtab[0x13].zErrMsg);
  pVtab[0x13].zErrMsg = (char *)0x0;
  psVar2 = pVtab[1].pModule;
  if ((sqlite3_mutex *)psVar2->xBestIndex == (sqlite3_mutex *)0x0) {
    psVar2->xClose = p_Var1;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar2->xBestIndex);
    psVar2->xClose = p_Var1;
    if ((sqlite3_mutex *)psVar2->xBestIndex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar2->xBestIndex);
    }
  }
  return iVar3;
}

Assistant:

static int fts3SavepointMethod(sqlite3_vtab *pVtab, int iSavepoint){
  int rc = SQLITE_OK;
  UNUSED_PARAMETER(iSavepoint);
  assert( ((Fts3Table *)pVtab)->inTransaction );
  assert( ((Fts3Table *)pVtab)->mxSavepoint <= iSavepoint );
  TESTONLY( ((Fts3Table *)pVtab)->mxSavepoint = iSavepoint );
  if( ((Fts3Table *)pVtab)->bIgnoreSavepoint==0 ){
    rc = fts3SyncMethod(pVtab);
  }
  return rc;
}